

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_addToPath(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *pcVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  ushort *puVar4;
  undefined4 in_register_00000034;
  long lVar5;
  
  if (oargc == (uint *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)(int)*oargc;
  }
  if (getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_addToPath::desc.min_argc_ = 1;
      getp_addToPath::desc.opt_argc_ = 0;
      getp_addToPath::desc.varargs_ = 0;
      __cxa_guard_release(&getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_addToPath::desc);
  if (iVar2 == 0) {
    puVar4 = (ushort *)get_local_path(sp_ + -1);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x900);
    }
    pcVar1 = (this->super_CVmObject).ext_;
    vVar3 = combine_path(pcVar1 + 8,(ulong)*(ushort *)(pcVar1 + 6),(char *)(puVar4 + 1),
                         (ulong)*puVar4,0);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    sp_ = sp_ + -lVar5;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_addToPath(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the target path - it can be a FileName or string */
    const char *file = get_local_path(vmg_ G_stk->get(0));
    if (file == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create a new object from the combined path */
    retval->set_obj(combine_path(
        vmg_ get_ext()->get_str(), get_ext()->get_len(),
        file + VMB_LEN, vmb_get_len(file), FALSE));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}